

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O0

fvar<double,_2UL> * __thiscall
ising::free_energy::triangular::anon_unknown_4::
functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::operator()
          (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
           *this,double t1,double t2)

{
  fvar<double,_2UL> *this_00;
  long in_RSI;
  fvar<double,_2UL> *in_RDI;
  double in_XMM0_Qa;
  fvar<double,_2UL> *cr;
  double in_XMM1_Qa;
  fvar<double,_2UL> *in_stack_fffffffffffffee8;
  fvar<double,_2UL> *in_stack_ffffffffffffff28;
  fvar<double,_2UL> *in_stack_ffffffffffffff30;
  fvar<double,_2UL> *in_stack_ffffffffffffff40;
  
  this_00 = (fvar<double,_2UL> *)(in_RSI + 8);
  cos(in_XMM0_Qa);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*
            (this_00,(root_type *)in_stack_fffffffffffffee8);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  cos(in_XMM1_Qa);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*
            (this_00,(root_type *)in_stack_fffffffffffffee8);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  cr = (fvar<double,_2UL> *)cos(in_XMM0_Qa + in_XMM1_Qa);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*
            (this_00,(root_type *)in_stack_fffffffffffffee8);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
            (in_stack_ffffffffffffff30,cr);
  boost::math::differentiation::autodiff_v1::detail::log<double,2ul>(in_stack_ffffffffffffff40);
  boost::math::differentiation::autodiff_v1::detail::operator*
            ((root_type *)this_00,in_stack_fffffffffffffee8);
  return in_RDI;
}

Assistant:

FVAR operator()(T t1, T t2) const {
    using std::cos;
    using std::log;
    return c_ * log(cshabc_ - sh2a_ * cos(t1) - sh2b_ * cos(t2) -
                    sh2c_ * cos(t1 + t2));
  }